

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_ram_list_entities_for_policy.cc
# Opt level: O0

void anon_unknown.dwarf_dc1b7::Json2Type(Value *value,RamListEntitiesForPolicyRoleType *item)

{
  bool bVar1;
  Value *pVVar2;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  RamListEntitiesForPolicyRoleType *local_18;
  RamListEntitiesForPolicyRoleType *item_local;
  Value *value_local;
  
  local_18 = item;
  item_local = (RamListEntitiesForPolicyRoleType *)value;
  bVar1 = Json::Value::isMember(value,"RoleId");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"RoleId");
    Json::Value::asString_abi_cxx11_(&local_38,pVVar2);
    std::__cxx11::string::operator=((string *)local_18,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"RoleName");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"RoleName");
    Json::Value::asString_abi_cxx11_(&local_58,pVVar2);
    std::__cxx11::string::operator=((string *)&local_18->role_name,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"Arn");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"Arn");
    Json::Value::asString_abi_cxx11_(&local_78,pVVar2);
    std::__cxx11::string::operator=((string *)&local_18->arn,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"Description");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"Description");
    Json::Value::asString_abi_cxx11_(&local_98,pVVar2);
    std::__cxx11::string::operator=((string *)&local_18->description,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"AttachDate");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"AttachDate");
    Json::Value::asString_abi_cxx11_(&local_b8,pVVar2);
    std::__cxx11::string::operator=((string *)&local_18->attach_date,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  return;
}

Assistant:

void Json2Type(const Json::Value& value, RamListEntitiesForPolicyRoleType* item) {
  if(value.isMember("RoleId")) {
    item->role_id = value["RoleId"].asString();
  }
  if(value.isMember("RoleName")) {
    item->role_name = value["RoleName"].asString();
  }
  if(value.isMember("Arn")) {
    item->arn = value["Arn"].asString();
  }
  if(value.isMember("Description")) {
    item->description = value["Description"].asString();
  }
  if(value.isMember("AttachDate")) {
    item->attach_date = value["AttachDate"].asString();
  }
}